

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::LoopGenerateSyntax::setChild
          (LoopGenerateSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_0041a384 + *(int *)(&DAT_0041a384 + index * 4)))();
  return;
}

Assistant:

void LoopGenerateSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: keyword = child.token(); return;
        case 2: openParen = child.token(); return;
        case 3: genvar = child.token(); return;
        case 4: identifier = child.token(); return;
        case 5: equals = child.token(); return;
        case 6: initialExpr = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 7: semi1 = child.token(); return;
        case 8: stopExpr = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 9: semi2 = child.token(); return;
        case 10: iterationExpr = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 11: closeParen = child.token(); return;
        case 12: block = child.node() ? &child.node()->as<MemberSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}